

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::AddRequiredTargetFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  cmake *this_00;
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  availableFeatures;
  string lang;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream e;
  
  sVar2 = cmGeneratorExpression::Find(feature);
  if (sVar2 == 0xffffffffffffffff) {
    lang._M_dataplus._M_p = (pointer)&lang.field_2;
    lang._M_string_length = 0;
    lang.field_2._M_local_buf[0] = '\0';
    bVar1 = CompileFeatureKnown(this,target,feature,&lang,error);
    if ((bVar1) && (pcVar3 = CompileFeaturesAvailable(this,&lang,error), pcVar3 != (char *)0x0)) {
      availableFeatures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      availableFeatures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      availableFeatures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&e,pcVar3,(allocator *)&bStack_258);
      cmSystemTools::ExpandListArgument((string *)&e,&availableFeatures,false);
      std::__cxx11::string::~string((string *)&e);
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (availableFeatures.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         availableFeatures.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,feature);
      if (_Var4._M_current ==
          availableFeatures.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,"The compiler feature \"");
        poVar5 = std::operator<<(poVar5,(string *)feature);
        poVar5 = std::operator<<(poVar5,"\" is not known to ");
        poVar5 = std::operator<<(poVar5,(string *)&lang);
        poVar5 = std::operator<<(poVar5," compiler\n\"");
        std::operator+(&local_1b8,"CMAKE_",&lang);
        std::operator+(&bStack_258,&local_1b8,"_COMPILER_ID");
        pcVar3 = GetDefinition(this,&bStack_258);
        poVar5 = std::operator<<(poVar5,pcVar3);
        poVar5 = std::operator<<(poVar5,"\"\nversion ");
        std::operator+(&local_1f8,"CMAKE_",&lang);
        std::operator+(&local_1d8,&local_1f8,"_COMPILER_VERSION");
        pcVar3 = GetDefinition(this,&local_1d8);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::operator<<(poVar5,".");
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&bStack_258);
        std::__cxx11::string::~string((string *)&local_1b8);
        if (error == (string *)0x0) {
          this_00 = this->GlobalGenerator->CMakeInstance;
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this_00,FATAL_ERROR,&bStack_258,&this->Backtrace);
        }
        else {
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)error,(string *)&bStack_258);
        }
        std::__cxx11::string::~string((string *)&bStack_258);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        bVar1 = false;
      }
      else {
        std::__cxx11::string::string((string *)&e,"COMPILE_FEATURES",(allocator *)&bStack_258);
        cmTarget::AppendProperty(target,(string *)&e,(feature->_M_dataplus)._M_p,false);
        std::__cxx11::string::~string((string *)&e);
        bVar1 = std::operator==(&lang,"C");
        if (bVar1) {
          bVar1 = AddRequiredTargetCFeature(this,target,feature,error);
        }
        else {
          bVar1 = AddRequiredTargetCxxFeature(this,target,feature,error);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&availableFeatures);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&lang);
  }
  else {
    std::__cxx11::string::string((string *)&e,"COMPILE_FEATURES",(allocator *)&lang);
    cmTarget::AppendProperty(target,(string *)&e,(feature->_M_dataplus)._M_p,false);
    std::__cxx11::string::~string((string *)&e);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmMakefile::AddRequiredTargetFeature(cmTarget* target,
                                          const std::string& feature,
                                          std::string* error) const
{
  if (cmGeneratorExpression::Find(feature) != std::string::npos) {
    target->AppendProperty("COMPILE_FEATURES", feature.c_str());
    return true;
  }

  std::string lang;
  if (!this->CompileFeatureKnown(target, feature, lang, error)) {
    return false;
  }

  const char* features = this->CompileFeaturesAvailable(lang, error);
  if (!features) {
    return false;
  }

  std::vector<std::string> availableFeatures;
  cmSystemTools::ExpandListArgument(features, availableFeatures);
  if (std::find(availableFeatures.begin(), availableFeatures.end(), feature) ==
      availableFeatures.end()) {
    std::ostringstream e;
    e << "The compiler feature \"" << feature << "\" is not known to " << lang
      << " compiler\n\""
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->GetDefinition("CMAKE_" + lang + "_COMPILER_VERSION") << ".";
    if (error) {
      *error = e.str();
    } else {
      this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                             this->Backtrace);
    }
    return false;
  }

  target->AppendProperty("COMPILE_FEATURES", feature.c_str());

  return lang == "C"
    ? this->AddRequiredTargetCFeature(target, feature, error)
    : this->AddRequiredTargetCxxFeature(target, feature, error);
}